

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * vera::cubeMesh(Mesh *__return_storage_ptr__,float _size)

{
  uint32_t indices [36];
  uint32_t auStack_108 [36];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_78;
  float local_74;
  float local_70;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_6c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_68;
  float local_64;
  float local_60;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_48;
  float local_44;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_40;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aStack_3c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aStack_38;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aStack_34;
  float local_30;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_2c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_28;
  float local_24;
  float local_20;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_1c;
  
  local_78.x = _size ^ 0x80000000;
  local_74 = _size;
  local_70 = _size;
  local_6c = local_78;
  local_68 = local_78;
  local_64 = _size;
  local_60 = _size;
  local_5c = local_78;
  local_58 = _size;
  fStack_54 = _size;
  fStack_50 = _size;
  fStack_4c = _size;
  local_48 = local_78;
  local_44 = _size;
  local_40 = local_78;
  aStack_3c = local_78;
  aStack_38 = local_78;
  aStack_34 = local_78;
  local_30 = _size;
  local_2c = local_78;
  local_28 = local_78;
  local_24 = _size;
  local_20 = _size;
  local_1c = local_78;
  memcpy(auStack_108,&DAT_002e2c80,0x90);
  Mesh::Mesh(__return_storage_ptr__);
  Mesh::addVertices(__return_storage_ptr__,(vec3 *)&local_78,8);
  Mesh::addIndices(__return_storage_ptr__,auStack_108,0x24);
  return __return_storage_ptr__;
}

Assistant:

Mesh cubeMesh(float _size) {
    float vertices[] = {
        -_size,  _size,  _size,
        -_size, -_size,  _size,
         _size, -_size,  _size,
         _size,  _size,  _size,
        -_size,  _size, -_size,
        -_size, -_size, -_size,
         _size, -_size, -_size,
         _size,  _size, -_size,
    };

    INDEX_TYPE indices[] = {
        0, 1, 2,
        0, 2, 3,
        3, 2, 6,
        3, 6, 7,
        0, 4, 7,
        0, 7, 3,
        4, 6, 7,
        4, 6, 5,
        0, 5, 4,
        0, 5, 1,
        1, 6, 5,
        1, 6, 2,
    };

    Mesh mesh;
    mesh.addVertices(reinterpret_cast<glm::vec3*>(vertices), 8);
    mesh.addIndices(indices, 36);
    return mesh;
}